

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanical.cpp
# Opt level: O3

Vector3d * __thiscall
Mechanization::CalculateVfkb(Vector3d *__return_storage_ptr__,Mechanization *this,Output now)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar3 = (this->prvOut).gy;
  dVar4 = (this->prvOut).gz;
  dVar1 = (this->prvOut).gx;
  dVar5 = (this->prvOut).ay;
  dVar6 = (this->prvOut).az;
  dVar2 = (this->prvOut).ax;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[0] =
       ((now.gz * dVar5 - dVar6 * now.gy) + (dVar3 * now.az - dVar4 * now.ay)) * 0.08333333333333333
       + (now.az * now.gy - now.ay * now.gz) * 0.5 + now.ax;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[1] =
       ((now.gx * dVar6 - dVar2 * now.gz) + (dVar4 * now.ax - dVar1 * now.az)) * 0.08333333333333333
       + (now.ax * now.gz - now.az * now.gx) * 0.5 + now.ay;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] =
       (now.gx * now.ay - now.ax * now.gy) * 0.5 + now.az +
       ((now.ay * dVar1 - now.ax * dVar3) + (now.gy * dVar2 - now.gx * dVar5)) * 0.08333333333333333
  ;
  return __return_storage_ptr__;
}

Assistant:

Vector3d Mechanization::CalculateVfkb(Output now) {
    Vector3d deltaVk(now.ax, now.ay, now.az);
    Vector3d deltaThetak(now.gx, now.gy, now.gz);

    Vector3d deltaVkPrv(prvOut.ax, prvOut.ay, prvOut.az);
    Vector3d deltaThetaPrv(prvOut.gx, prvOut.gy, prvOut.gz);

    Vector3d RotationCompensation = 0.5 * deltaThetak.cross(deltaVk);
    Vector3d ScullingCompensation = 1.0 / 12.0 * (deltaThetaPrv.cross(deltaVk) + deltaVkPrv.cross(deltaThetak));

    return (deltaVk + RotationCompensation + ScullingCompensation);
}